

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

void des_cbc_encrypt(ssh_cipher *ciph,void *vdata,int len)

{
  LR LVar1;
  LR ciphertext;
  LR cipher_in;
  LR plaintext;
  uint8_t *data;
  des_cbc_ctx *ctx;
  int len_local;
  void *vdata_local;
  ssh_cipher *ciph_local;
  
  plaintext = (LR)vdata;
  for (ctx._4_4_ = len; 0 < ctx._4_4_; ctx._4_4_ = ctx._4_4_ + -8) {
    LVar1 = des_load_lr((void *)plaintext);
    LVar1 = des_xor_lr(LVar1,*(LR *)(ciph + -1));
    LVar1 = des_full_cipher(LVar1,(des_keysched *)(ciph + -0x11),0,1);
    des_store_lr((void *)plaintext,LVar1);
    *(LR *)(ciph + -1) = LVar1;
    plaintext = (LR)((long)plaintext + 8);
  }
  return;
}

Assistant:

static void des_cbc_encrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des_cbc_ctx *ctx = container_of(ciph, struct des_cbc_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    for (; len > 0; len -= 8, data += 8) {
        LR plaintext = des_load_lr(data);
        LR cipher_in = des_xor_lr(plaintext, ctx->iv);
        LR ciphertext = des_full_cipher(cipher_in, &ctx->sched, ENCIPHER);
        des_store_lr(data, ciphertext);
        ctx->iv = ciphertext;
    }
}